

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void rename_cb(uv_fs_t *req)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  uv_fs_t *__s1;
  char *pcVar5;
  char *pcVar6;
  uv_fs_t *puVar7;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_buf_t uVar8;
  uv_loop_t *puStack_c8;
  uint uStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  uv_fs_t *puStack_a0;
  code *pcStack_98;
  code *pcStack_90;
  uv_loop_t *puStack_88;
  uint uStack_80;
  char *pcStack_78;
  
  if (req == &rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_0015ba9e;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    rename_cb_cold_1();
LAB_0015ba9e:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (req == &open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_0015bb8f;
    iVar2 = (int)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_0015bb94;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_0015bb99;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_0015bb9e;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar4 = loop;
    iVar1 = uv_fs_read(loop,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    iVar2 = (int)puVar4;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_0015bb8f:
    iVar2 = (int)req;
    open_cb_cold_2();
LAB_0015bb94:
    open_cb_cold_6();
LAB_0015bb99:
    open_cb_cold_5();
LAB_0015bb9e:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(iVar2);
  fs_file_sync(iVar2);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar4 = (uv_loop_t *)uv_default_loop();
  loop = puVar4;
  iVar2 = uv_fs_open(puVar4,&open_req1,"test_file",0x41,0x180,0);
  iVar1 = (int)puVar4;
  if (iVar2 < 0) {
    fs_file_sync_cold_1();
LAB_0015bffc:
    fs_file_sync_cold_2();
LAB_0015c001:
    fs_file_sync_cold_3();
LAB_0015c006:
    fs_file_sync_cold_4();
LAB_0015c00b:
    fs_file_sync_cold_5();
LAB_0015c010:
    fs_file_sync_cold_6();
LAB_0015c015:
    fs_file_sync_cold_7();
LAB_0015c01a:
    fs_file_sync_cold_8();
LAB_0015c01f:
    fs_file_sync_cold_9();
LAB_0015c024:
    fs_file_sync_cold_10();
LAB_0015c029:
    fs_file_sync_cold_11();
LAB_0015c02e:
    fs_file_sync_cold_12();
LAB_0015c033:
    fs_file_sync_cold_13();
LAB_0015c038:
    fs_file_sync_cold_14();
LAB_0015c03d:
    fs_file_sync_cold_15();
LAB_0015c042:
    fs_file_sync_cold_16();
LAB_0015c047:
    fs_file_sync_cold_17();
LAB_0015c04c:
    fs_file_sync_cold_18();
LAB_0015c051:
    fs_file_sync_cold_19();
LAB_0015c056:
    fs_file_sync_cold_20();
LAB_0015c05b:
    fs_file_sync_cold_21();
LAB_0015c060:
    fs_file_sync_cold_22();
LAB_0015c065:
    fs_file_sync_cold_23();
LAB_0015c06a:
    fs_file_sync_cold_24();
LAB_0015c06f:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015bffc;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015c001;
    if (write_req.result < 0) goto LAB_0015c006;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c00b;
    if (close_req.result != 0) goto LAB_0015c010;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
    if (iVar2 < 0) goto LAB_0015c015;
    if (open_req1.result._4_4_ < 0) goto LAB_0015c01a;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015c01f;
    if (read_req.result < 0) goto LAB_0015c024;
    iVar1 = 0x2f84e0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015c029;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_ftruncate(0,&ftruncate_req,(int)open_req1.result,7,0);
    if (iVar2 != 0) goto LAB_0015c02e;
    if (ftruncate_req.result != 0) goto LAB_0015c033;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c038;
    if (close_req.result != 0) goto LAB_0015c03d;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar2 != 0) goto LAB_0015c042;
    if (rename_req.result != 0) goto LAB_0015c047;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar2 < 0) goto LAB_0015c04c;
    if (open_req1.result._4_4_ < 0) goto LAB_0015c051;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar1 = 0;
    iov = uVar8;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015c056;
    if (read_req.result < 0) goto LAB_0015c05b;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_0015c060;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c065;
    if (close_req.result != 0) goto LAB_0015c06a;
    uv_fs_req_cleanup();
    iVar1 = 0;
    iVar2 = uv_fs_unlink(0,&unlink_req,"test_file2",0);
    if (iVar2 != 0) goto LAB_0015c06f;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar1);
  fs_file_write_null_buffer(iVar1);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_0015c1ce:
    fs_file_write_null_buffer_cold_2();
LAB_0015c1d3:
    fs_file_write_null_buffer_cold_3();
LAB_0015c1d8:
    fs_file_write_null_buffer_cold_4();
LAB_0015c1dd:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015c1ce;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(0,0);
    iov = uVar8;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_0015c1d3;
    if (write_req.result != 0) goto LAB_0015c1d8;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c1dd;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStack_78 = "test_file";
  pcStack_90 = (code *)0x15c200;
  unlink("test_dir/file1");
  pcStack_90 = (code *)0x15c20c;
  unlink("test_dir/file2");
  pcVar5 = "test_dir";
  pcStack_90 = (code *)0x15c21b;
  rmdir("test_dir");
  pcStack_90 = (code *)0x15c220;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_90 = (code *)0x15c245;
  loop = (uv_loop_t *)__s1;
  iVar2 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    pcStack_90 = (code *)0x15c25b;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015c668;
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c28b;
    iVar2 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015c66d;
    pcStack_90 = (code *)0x15c29f;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c2b5;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c672;
    pcStack_90 = (code *)0x15c2c9;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c2ec;
    iVar2 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015c677;
    pcStack_90 = (code *)0x15c300;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c316;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015c67c;
    pcStack_90 = (code *)0x15c32a;
    uv_fs_req_cleanup(&close_req);
    pcStack_90 = (code *)0x15c34d;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar2 != 0) goto LAB_0015c681;
    pcStack_90 = (code *)0x15c363;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_0015c686;
    __s1 = (uv_fs_t *)0x0;
    pcStack_90 = (code *)0x15c38a;
    iVar2 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar2 != 2) goto LAB_0015c68b;
    if (scandir_req.result != 2) goto LAB_0015c690;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c695;
    pcStack_90 = (code *)0x15c3be;
    iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_88);
    if (iVar2 != -0xfff) {
      pcVar5 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)puStack_88;
        pcVar6 = "file1";
        pcStack_90 = (code *)0x15c3ec;
        iVar2 = strcmp((char *)puStack_88,"file1");
        if (iVar2 != 0) {
          pcVar6 = "file2";
          pcStack_90 = (code *)0x15c3fb;
          iVar2 = strcmp((char *)__s1,"file2");
          if (iVar2 != 0) {
            pcStack_90 = (code *)0x15c663;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &puStack_88;
            goto LAB_0015c663;
          }
        }
        dent.name = (char *)(ulong)uStack_80;
        pcStack_90 = (code *)0x15c40c;
        dent._8_8_ = pcVar6;
        assert_is_file_type(dent);
        pcStack_90 = (code *)0x15c417;
        iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_88);
        unaff_R15 = &puStack_88;
      } while (iVar2 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_90 = (code *)0x15c42a;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_0015c69a;
    pcStack_90 = (code *)0x15c459;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar2 != 0) goto LAB_0015c69f;
    pcStack_90 = (code *)0x15c46f;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c490;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar2 != 0) goto LAB_0015c6a4;
    pcStack_90 = (code *)0x15c4a6;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c4c7;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar2 != 0) goto LAB_0015c6a9;
    pcStack_90 = (code *)0x15c4dd;
    uv_run(loop,0);
    pcStack_90 = (code *)0x15c4fe;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar2 != 0) goto LAB_0015c6ae;
    pcStack_90 = (code *)0x15c514;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_0015c6b3;
    pcStack_90 = (code *)0x15c542;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar2 != 0) goto LAB_0015c6b8;
    pcStack_90 = (code *)0x15c558;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_0015c6bd;
    pcStack_90 = (code *)0x15c586;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar2 != 0) goto LAB_0015c6c2;
    pcStack_90 = (code *)0x15c59c;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_0015c6c7;
    pcStack_90 = (code *)0x15c5ca;
    __s1 = (uv_fs_t *)loop;
    iVar2 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar2 != 0) goto LAB_0015c6cc;
    pcStack_90 = (code *)0x15c5e0;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_0015c6d1;
    pcStack_90 = (code *)0x15c5f9;
    unlink("test_dir/file1");
    pcStack_90 = (code *)0x15c605;
    unlink("test_dir/file2");
    pcStack_90 = (code *)0x15c611;
    rmdir("test_dir");
    pcStack_90 = (code *)0x15c616;
    pcVar5 = (char *)uv_default_loop();
    pcStack_90 = (code *)0x15c62a;
    uv_walk(pcVar5,close_walk_cb,0);
    pcStack_90 = (code *)0x15c634;
    uv_run(pcVar5,0);
    pcStack_90 = (code *)0x15c639;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_90 = (code *)0x15c641;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      pcStack_90 = (code *)0x15c64e;
      uv_library_shutdown();
      return;
    }
  }
  else {
LAB_0015c663:
    pcStack_90 = (code *)0x15c668;
    run_test_fs_async_dir_cold_1();
LAB_0015c668:
    pcStack_90 = (code *)0x15c66d;
    run_test_fs_async_dir_cold_2();
LAB_0015c66d:
    pcStack_90 = (code *)0x15c672;
    run_test_fs_async_dir_cold_3();
LAB_0015c672:
    pcStack_90 = (code *)0x15c677;
    run_test_fs_async_dir_cold_4();
LAB_0015c677:
    pcStack_90 = (code *)0x15c67c;
    run_test_fs_async_dir_cold_5();
LAB_0015c67c:
    pcStack_90 = (code *)0x15c681;
    run_test_fs_async_dir_cold_6();
LAB_0015c681:
    pcStack_90 = (code *)0x15c686;
    run_test_fs_async_dir_cold_7();
LAB_0015c686:
    pcStack_90 = (code *)0x15c68b;
    run_test_fs_async_dir_cold_8();
LAB_0015c68b:
    pcStack_90 = (code *)0x15c690;
    run_test_fs_async_dir_cold_9();
LAB_0015c690:
    pcStack_90 = (code *)0x15c695;
    run_test_fs_async_dir_cold_10();
LAB_0015c695:
    pcStack_90 = (code *)0x15c69a;
    run_test_fs_async_dir_cold_25();
LAB_0015c69a:
    pcStack_90 = (code *)0x15c69f;
    run_test_fs_async_dir_cold_12();
LAB_0015c69f:
    pcStack_90 = (code *)0x15c6a4;
    run_test_fs_async_dir_cold_13();
LAB_0015c6a4:
    pcStack_90 = (code *)0x15c6a9;
    run_test_fs_async_dir_cold_14();
LAB_0015c6a9:
    pcStack_90 = (code *)0x15c6ae;
    run_test_fs_async_dir_cold_15();
LAB_0015c6ae:
    pcStack_90 = (code *)0x15c6b3;
    run_test_fs_async_dir_cold_16();
LAB_0015c6b3:
    pcStack_90 = (code *)0x15c6b8;
    run_test_fs_async_dir_cold_17();
LAB_0015c6b8:
    pcStack_90 = (code *)0x15c6bd;
    run_test_fs_async_dir_cold_18();
LAB_0015c6bd:
    pcStack_90 = (code *)0x15c6c2;
    run_test_fs_async_dir_cold_19();
LAB_0015c6c2:
    pcStack_90 = (code *)0x15c6c7;
    run_test_fs_async_dir_cold_20();
LAB_0015c6c7:
    pcStack_90 = (code *)0x15c6cc;
    run_test_fs_async_dir_cold_21();
LAB_0015c6cc:
    pcStack_90 = (code *)0x15c6d1;
    run_test_fs_async_dir_cold_22();
LAB_0015c6d1:
    pcStack_90 = (code *)0x15c6d6;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_90 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015c735;
    if (mkdir_req.result != 0) goto LAB_0015c73a;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0015c73f;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    pcStack_98 = (code *)0x15c735;
    mkdir_cb_cold_1();
LAB_0015c735:
    pcStack_98 = (code *)0x15c73a;
    mkdir_cb_cold_2();
LAB_0015c73a:
    pcStack_98 = (code *)0x15c73f;
    mkdir_cb_cold_3();
LAB_0015c73f:
    pcStack_98 = (code *)0x15c744;
    mkdir_cb_cold_5();
  }
  pcStack_98 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_b8 = pcVar5;
  pcStack_b0 = unaff_R12;
  puStack_a0 = unaff_R14;
  pcStack_98 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar7 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015c850;
    if (scandir_req.result != 2) goto LAB_0015c855;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015c85a;
    puVar7 = &scandir_req;
    iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_c8);
    __s1 = (uv_fs_t *)puStack_c8;
    while (iVar2 != -0xfff) {
      pcVar5 = "file1";
      puStack_c8 = (uv_loop_t *)__s1;
      iVar2 = strcmp((char *)__s1,"file1");
      if (iVar2 != 0) {
        pcVar5 = "file2";
        iVar2 = strcmp((char *)__s1,"file2");
        if (iVar2 != 0) {
          scandir_cb_cold_4();
          goto LAB_0015c84b;
        }
      }
      dent_00.name = (char *)(ulong)uStack_c0;
      dent_00._8_8_ = pcVar5;
      assert_is_file_type(dent_00);
      puVar7 = &scandir_req;
      iVar2 = uv_fs_scandir_next(&scandir_req,&puStack_c8);
      __s1 = (uv_fs_t *)puStack_c8;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015c85f;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015c864;
    puVar7 = &scandir_req;
    uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_0015c84b:
    scandir_cb_cold_1();
    puVar7 = __s1;
LAB_0015c850:
    scandir_cb_cold_2();
LAB_0015c855:
    scandir_cb_cold_3();
LAB_0015c85a:
    scandir_cb_cold_8();
LAB_0015c85f:
    scandir_cb_cold_7();
LAB_0015c864:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar7 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar7 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015c8cc;
    if (stat_req.result != 0) goto LAB_0015c8d1;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015c8d6;
    stat_cb_count = stat_cb_count + 1;
    puVar7 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015c8cc:
    stat_cb_cold_2();
LAB_0015c8d1:
    stat_cb_cold_3();
LAB_0015c8d6:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar7 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015c918;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015c918:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar7 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015c97c;
    if (rmdir_req.result != 0) goto LAB_0015c981;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_0015c98b;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015c97c:
    rmdir_cb_cold_2();
LAB_0015c981:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015c98b:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return;
}

Assistant:

static void rename_cb(uv_fs_t* req) {
  ASSERT(req == &rename_req);
  ASSERT(req->fs_type == UV_FS_RENAME);
  ASSERT(req->result == 0);
  rename_cb_count++;
  uv_fs_req_cleanup(req);
}